

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

SchnorrPubkey *
cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,ByteData256 *tweak,
          Privkey *tweaked_privkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *pCVar2;
  int pk_parity;
  secp256k1_xonly_pubkey x_only_pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_keypair keypair;
  Privkey local_128;
  int local_104;
  undefined1 local_100 [64];
  ByteData local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  secp256k1_keypair local_90;
  
  ByteData256::GetBytes(&local_a8,tweak);
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_128.data_,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,
                     &local_128.data_);
  iVar1 = secp256k1_keypair_create(ctx,&local_90,(uchar *)local_100._0_8_);
  if ((uchar *)local_100._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ - local_100._0_8_);
  }
  if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar1 != 1) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._0_8_ = local_100 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Invalid private key","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_100);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar1 = secp256k1_keypair_xonly_tweak_add
                    (ctx,&local_90,
                     local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (iVar1 != 1) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._0_8_ = local_100 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Could not tweak add key pair","");
    CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_100);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_104 = 0;
  iVar1 = secp256k1_keypair_xonly_pub(ctx,(secp256k1_xonly_pubkey *)local_100,&local_104,&local_90);
  if (iVar1 == 1) {
    if (tweaked_privkey != (Privkey *)0x0) {
      ByteData::ByteData(&local_c0,local_90.data,0x20);
      Privkey::Privkey(&local_128,&local_c0,kMainnet,true);
      ByteData::operator=(&tweaked_privkey->data_,&local_128.data_);
      tweaked_privkey->is_compressed_ = local_128.is_compressed_;
      *(undefined3 *)&tweaked_privkey->field_0x19 = local_128._25_3_;
      tweaked_privkey->net_type_ = local_128.net_type_;
      if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (parity != (bool *)0x0) {
      *parity = local_104 != 0;
    }
    ConvertSchnorrPubkey((ByteData256 *)&local_128,(secp256k1_xonly_pubkey *)local_100);
    SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)&local_128);
    if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  CfdException::CfdException(pCVar2,kCfdInternalError);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey SchnorrPubkey::CreateTweakAddFromPrivkey(
    const Privkey &privkey, const ByteData256 &tweak, Privkey *tweaked_privkey,
    bool *parity) {
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  auto ctx = wally_get_secp_context();

  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  ret = secp256k1_keypair_xonly_tweak_add(ctx, &keypair, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add key pair");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);
  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (tweaked_privkey != nullptr) {
    *tweaked_privkey = Privkey(ByteData(keypair.data, Privkey::kPrivkeySize));
  }
  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}